

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

void Gia_ManAreFree(Gia_ManAre_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Vec_t *pVVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  
  Gia_ManStop(p->pAig);
  if (p->pNew != (Gia_Man_t *)0x0) {
    Gia_ManStop(p->pNew);
  }
  pVVar1 = p->vCubesA;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCubesB;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar3 = p->vCiTfos;
  iVar5 = pVVar3->nSize;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      pvVar4 = pVVar3->pArray[lVar6];
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
        }
        free(pvVar4);
        iVar5 = pVVar3->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  pVVar3 = p->vCiLits;
  iVar5 = pVVar3->nSize;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      pvVar4 = pVVar3->pArray[lVar6];
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
        }
        free(pvVar4);
        iVar5 = pVVar3->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  iVar5 = p->nObjPages;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      if (p->ppObjs[lVar6] != (uint *)0x0) {
        free(p->ppObjs[lVar6]);
        p->ppObjs[lVar6] = (uint *)0x0;
        iVar5 = p->nObjPages;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  if (p->ppObjs != (uint **)0x0) {
    free(p->ppObjs);
    p->ppObjs = (uint **)0x0;
  }
  iVar5 = p->nStaPages;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      if (p->ppStas[lVar6] != (uint *)0x0) {
        free(p->ppStas[lVar6]);
        p->ppStas[lVar6] = (uint *)0x0;
        iVar5 = p->nStaPages;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  if (p->ppStas != (uint **)0x0) {
    free(p->ppStas);
  }
  free(p);
  return;
}

Assistant:

void Gia_ManAreFree( Gia_ManAre_t * p )
{
    int i;
    Gia_ManStop( p->pAig );
    if ( p->pNew )
        Gia_ManStop( p->pNew );
    Vec_IntFree( p->vCubesA );
    Vec_IntFree( p->vCubesB );
    Vec_VecFree( p->vCiTfos );
    Vec_VecFree( p->vCiLits );
    for ( i = 0; i < p->nObjPages; i++ )
        ABC_FREE( p->ppObjs[i] );
    ABC_FREE( p->ppObjs );
    for ( i = 0; i < p->nStaPages; i++ )
        ABC_FREE( p->ppStas[i] );
    ABC_FREE( p->ppStas );
//    ABC_FREE( p->pfUseless );
    ABC_FREE( p );
}